

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLFunctionLoader.cpp
# Opt level: O1

void __thiscall eglu::GLLibraryCache::~GLLibraryCache(GLLibraryCache *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_libraries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_libraries)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>,_std::_Select1st<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
  ::~_Rb_tree(&(this->m_libraries)._M_t);
  return;
}

Assistant:

GLLibraryCache::~GLLibraryCache (void)
{
	for (LibraryMap::iterator i = m_libraries.begin(); i != m_libraries.end(); ++i)
		delete i->second;
}